

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdns.cpp
# Opt level: O0

uint8_t * __thiscall
cdns::dump_block(cdns *this,uint8_t *in,uint8_t *in_max,char *out_buf,char *out_max,int cdns_version
                ,int *err,FILE *F_out)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint local_54;
  int inner_type;
  int rank;
  int is_undef;
  int outer_type;
  int64_t val;
  char *p_out;
  char *pcStack_30;
  int cdns_version_local;
  char *out_max_local;
  char *out_buf_local;
  uint8_t *in_max_local;
  uint8_t *in_local;
  cdns *this_local;
  
  bVar1 = *in;
  p_out._4_4_ = cdns_version;
  pcStack_30 = out_max;
  out_max_local = out_buf;
  out_buf_local = (char *)in_max;
  in_max_local = in;
  in_local = (uint8_t *)this;
  in_max_local = cbor_get_number(in,in_max,(int64_t *)&is_undef);
  if ((in_max_local == (uint8_t *)0x0) || ((int)(uint)bVar1 >> 5 != 4)) {
    fprintf((FILE *)F_out,"   Error, cannot parse the first bytes of block, type=%d.\n",
            (ulong)(uint)((int)(uint)bVar1 >> 5));
    *err = -3;
    in_max_local = (uint8_t *)0x0;
  }
  else {
    local_54 = 0;
    fprintf((FILE *)F_out,"    [\n");
    bVar3 = _is_undef == -1;
    if (bVar3) {
      _is_undef = 0xffffffff;
    }
    while( true ) {
      bVar2 = false;
      if ((0 < _is_undef) && (bVar2 = false, in_max_local != (uint8_t *)0x0)) {
        bVar2 = in_max_local < out_buf_local;
      }
      if (!bVar2) goto LAB_001cf653;
      if (*in_max_local == 0xff) break;
      if ((int)(uint)*in_max_local >> 5 == 5) {
        in_max_local = dump_block_properties
                                 (this,in_max_local,(uint8_t *)out_buf_local,out_max_local,
                                  pcStack_30,p_out._4_4_,err,F_out);
      }
      else {
        val = (int64_t)out_max_local;
        local_54 = local_54 + 1;
        fprintf((FILE *)F_out,"        -- Property %d:\n    ",(ulong)local_54);
        in_max_local = cbor_to_text(in_max_local,(uint8_t *)out_buf_local,(char **)&val,pcStack_30,
                                    err);
        fwrite(out_max_local,1,val - (long)out_max_local,(FILE *)F_out);
        fprintf((FILE *)F_out,"\n");
      }
      _is_undef = _is_undef + -1;
    }
    fprintf((FILE *)F_out,"        --end of array");
    if (bVar3) {
      in_max_local = in_max_local + 1;
    }
    else {
      fprintf((FILE *)F_out,"        Error, end of array mark unexpected.\n");
      *err = -3;
      in_max_local = (uint8_t *)0x0;
    }
LAB_001cf653:
    if (in_max_local != (uint8_t *)0x0) {
      fprintf((FILE *)F_out,"\n    ]\n");
    }
  }
  return in_max_local;
}

Assistant:

uint8_t* cdns::dump_block(uint8_t* in, uint8_t* in_max, char* out_buf, char* out_max, int cdns_version, int* err, FILE* F_out)
{
    char* p_out;
    int64_t val;
    int outer_type = CBOR_CLASS(*in);
    int is_undef = 0;

    in = cbor_get_number(in, in_max, &val);

    if (in == NULL || outer_type != CBOR_T_ARRAY) {
        fprintf(F_out, "   Error, cannot parse the first bytes of block, type=%d.\n", outer_type);
        *err = CBOR_MALFORMED_VALUE;
        in = NULL;
    }
    else {
        int rank = 0;

        fprintf(F_out, "    [\n");
        if (val == CBOR_END_OF_ARRAY) {
            is_undef = 1;
            val = 0xffffffff;
        }

        while (val > 0 && in != NULL && in < in_max) {
            if (*in == 0xff) {
                fprintf(F_out, "        --end of array");
                if (is_undef) {
                    in++;
                }
                else {
                    fprintf(F_out, "        Error, end of array mark unexpected.\n");
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                break;
            }
            else {
                int inner_type = CBOR_CLASS(*in);

                if (inner_type == CBOR_T_MAP) {
                    /* Records are held in a map */
                    in = dump_block_properties(in, in_max, out_buf, out_max, cdns_version, err, F_out);
                }
                else {
                    p_out = out_buf;
                    rank++;
                    fprintf(F_out, "        -- Property %d:\n    ", rank);
                    in = cbor_to_text(in, in_max, &p_out, out_max, err);
                    fwrite(out_buf, 1, p_out - out_buf, F_out);
                    fprintf(F_out, "\n");
                }
                val--;
            }
        }

        if (in != NULL) {
            fprintf(F_out, "\n    ]\n");
        }

    }

    return in;
}